

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrPassthroughColorLutCreateInfoMETA *value)

{
  pointer *this;
  pointer *this_00;
  bool bVar1;
  allocator local_461;
  string local_460 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_440;
  allocator local_421;
  string local_420 [32];
  string local_400 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3e0;
  allocator local_3c1;
  string local_3c0 [32];
  string local_3a0 [32];
  ostringstream local_380 [8];
  ostringstream oss_enum;
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_190;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [40];
  string local_128 [8];
  string error_message;
  allocator local_101;
  string local_100 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e0;
  allocator local_c1;
  string local_c0 [52];
  NextChainResult local_8c;
  undefined1 local_88 [4];
  NextChainResult next_result;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrPassthroughColorLutCreateInfoMETA *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_PASSTHROUGH_COLOR_LUT_CREATE_INFO_META) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrPassthroughColorLutCreateInfoMETA",
               value->type,"VUID-XrPassthroughColorLutCreateInfoMETA-type-type",
               XR_TYPE_PASSTHROUGH_COLOR_LUT_CREATE_INFO_META,
               "XR_TYPE_PASSTHROUGH_COLOR_LUT_CREATE_INFO_META");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    this_00 = &encountered_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this_00);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)this_00);
    if (local_8c == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c0,"VUID-XrPassthroughColorLutCreateInfoMETA-next-next",&local_c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_e0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,
                 "Invalid structure(s) in \"next\" chain for XrPassthroughColorLutCreateInfoMETA struct \"next\""
                 ,&local_101);
      CoreValidLogMessage(instance_info,(string *)local_c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_e0,(string *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_e0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_8c == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_128,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_150 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x27));
      std::__cxx11::string::operator+=(local_128,"XrPassthroughColorLutCreateInfoMETA : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_150,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_128,(string *)local_150);
      std::__cxx11::string::~string((string *)local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_170,"VUID-XrPassthroughColorLutCreateInfoMETA-next-unique",&local_171);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_190,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b0,
                 "Multiple structures of the same type(s) in \"next\" chain for XrPassthroughColorLutCreateInfoMETA struct"
                 ,&local_1b1);
      CoreValidLogMessage(instance_info,(string *)local_170,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_190,(string *)local_1b0);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_190);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_128);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"XrPassthroughColorLutCreateInfoMETA",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,"channels",&local_201);
    bVar1 = ValidateXrEnum(instance_info,command_name,(string *)local_1d8,(string *)local_200,
                           objects_info,value->channels);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      instance_info_local._4_4_ =
           ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,&value->data)
      ;
      if (instance_info_local._4_4_ != XR_SUCCESS) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_420,"VUID-XrPassthroughColorLutCreateInfoMETA-data-parameter",&local_421);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_440,objects_info);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_460,"Structure XrPassthroughColorLutCreateInfoMETA member data is invalid",
                   &local_461);
        CoreValidLogMessage(instance_info,(string *)local_420,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_440,(string *)local_460);
        std::__cxx11::string::~string(local_460);
        std::allocator<char>::~allocator((allocator<char> *)&local_461);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_440);
        std::__cxx11::string::~string(local_420);
        std::allocator<char>::~allocator((allocator<char> *)&local_421);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_380);
      std::operator<<((ostream *)local_380,
                      "XrPassthroughColorLutCreateInfoMETA contains invalid XrPassthroughColorLutChannelsMETA \"channels\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_((uint32_t)local_3a0);
      std::operator<<((ostream *)local_380,local_3a0);
      std::__cxx11::string::~string(local_3a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3c0,"VUID-XrPassthroughColorLutCreateInfoMETA-channels-parameter",&local_3c1)
      ;
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_3e0,objects_info);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(instance_info,(string *)local_3c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_3e0,local_400);
      std::__cxx11::string::~string((string *)local_400);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_3e0);
      std::__cxx11::string::~string(local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::ostringstream::~ostringstream(local_380);
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrPassthroughColorLutCreateInfoMETA* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_PASSTHROUGH_COLOR_LUT_CREATE_INFO_META) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrPassthroughColorLutCreateInfoMETA",
                             value->type, "VUID-XrPassthroughColorLutCreateInfoMETA-type-type", XR_TYPE_PASSTHROUGH_COLOR_LUT_CREATE_INFO_META, "XR_TYPE_PASSTHROUGH_COLOR_LUT_CREATE_INFO_META");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrPassthroughColorLutCreateInfoMETA-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrPassthroughColorLutCreateInfoMETA struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrPassthroughColorLutCreateInfoMETA : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrPassthroughColorLutCreateInfoMETA-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrPassthroughColorLutCreateInfoMETA struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrPassthroughColorLutChannelsMETA value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrPassthroughColorLutCreateInfoMETA", "channels", objects_info, value->channels)) {
        std::ostringstream oss_enum;
        oss_enum << "XrPassthroughColorLutCreateInfoMETA contains invalid XrPassthroughColorLutChannelsMETA \"channels\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->channels));
        CoreValidLogMessage(instance_info, "VUID-XrPassthroughColorLutCreateInfoMETA-channels-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Validate that the structure XrPassthroughColorLutDataMETA is valid
    xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                     check_members, true, &value->data);
    if (XR_SUCCESS != xr_result) {
        CoreValidLogMessage(instance_info, "VUID-XrPassthroughColorLutCreateInfoMETA-data-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrPassthroughColorLutCreateInfoMETA member data is invalid");
        return xr_result;
    }
    // Everything checked out properly
    return xr_result;
}